

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quass.cpp
# Opt level: O3

void loginformation(Runtime *rt,Basis *basis,CholeskyFactor *factor,HighsTimer *timer)

{
  iterator iVar1;
  iterator iVar2;
  int iVar3;
  size_t __nbytes;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  Statistics *pSVar4;
  double extraout_XMM0_Qa;
  SumNum SVar5;
  double local_40;
  int local_38 [2];
  double local_30;
  
  pSVar4 = rt->statistics;
  iVar1._M_current =
       (pSVar4->iteration).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (pSVar4->iteration).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&pSVar4->iteration,iVar1,&pSVar4->num_iterations);
    pSVar4 = rt->statistics;
  }
  else {
    *iVar1._M_current = pSVar4->num_iterations;
    (pSVar4->iteration).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  __nbytes = (ulong)((long)(basis->active_constraint_index).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(basis->active_constraint_index).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
  iVar3 = (rt->instance).num_var - (int)__nbytes;
  local_40 = (double)CONCAT44(local_40._4_4_,iVar3);
  iVar1._M_current =
       (pSVar4->nullspacedimension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (pSVar4->nullspacedimension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&pSVar4->nullspacedimension,iVar1,(int *)&local_40);
    pSVar4 = rt->statistics;
  }
  else {
    *iVar1._M_current = iVar3;
    (pSVar4->nullspacedimension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  local_40 = Instance::objval(&rt->instance,&rt->primal);
  iVar2._M_current =
       (pSVar4->objval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pSVar4->objval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&pSVar4->objval,iVar2,&local_40);
    __buf = extraout_RDX_00;
  }
  else {
    *iVar2._M_current = local_40;
    (pSVar4->objval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    __buf = extraout_RDX;
  }
  pSVar4 = rt->statistics;
  HighsTimer::read(timer,0,__buf,__nbytes);
  iVar2._M_current =
       (pSVar4->time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pSVar4->time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&pSVar4->time,iVar2,&local_40);
  }
  else {
    *iVar2._M_current = extraout_XMM0_Qa;
    (pSVar4->time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  SVar5 = Instance::sumnumprimalinfeasibilities(&rt->instance,&rt->primal,&rt->rowactivity);
  local_40 = SVar5.sum;
  local_38[0] = SVar5.num;
  pSVar4 = rt->statistics;
  iVar2._M_current =
       (pSVar4->sum_primal_infeasibilities).super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pSVar4->sum_primal_infeasibilities).super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&pSVar4->sum_primal_infeasibilities,iVar2,
               &local_40);
    pSVar4 = rt->statistics;
  }
  else {
    *iVar2._M_current = local_40;
    (pSVar4->sum_primal_infeasibilities).super__Vector_base<double,_std::allocator<double>_>._M_impl
    .super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar1._M_current =
       (pSVar4->num_primal_infeasibilities).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (pSVar4->num_primal_infeasibilities).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&pSVar4->num_primal_infeasibilities,iVar1,local_38
              );
    pSVar4 = rt->statistics;
  }
  else {
    *iVar1._M_current = local_38[0];
    (pSVar4->num_primal_infeasibilities).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  local_30 = CholeskyFactor::density(factor);
  iVar2._M_current =
       (pSVar4->density_factor).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pSVar4->density_factor).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&pSVar4->density_factor,iVar2,&local_30);
  }
  else {
    *iVar2._M_current = local_30;
    (pSVar4->density_factor).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  pSVar4 = rt->statistics;
  local_30 = 0.0;
  iVar2._M_current =
       (pSVar4->density_nullspace).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pSVar4->density_nullspace).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&pSVar4->density_nullspace,iVar2,&local_30);
  }
  else {
    *iVar2._M_current = 0.0;
    (pSVar4->density_nullspace).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  return;
}

Assistant:

static void loginformation(Runtime& rt, Basis& basis, CholeskyFactor& factor,
                           HighsTimer& timer) {
  rt.statistics.iteration.push_back(rt.statistics.num_iterations);
  rt.statistics.nullspacedimension.push_back(rt.instance.num_var -
                                             basis.getnumactive());
  rt.statistics.objval.push_back(rt.instance.objval(rt.primal));
  rt.statistics.time.push_back(timer.read());
  SumNum sm =
      rt.instance.sumnumprimalinfeasibilities(rt.primal, rt.rowactivity);
  rt.statistics.sum_primal_infeasibilities.push_back(sm.sum);
  rt.statistics.num_primal_infeasibilities.push_back(sm.num);
  rt.statistics.density_factor.push_back(factor.density());
  rt.statistics.density_nullspace.push_back(0.0);
}